

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hxx
# Opt level: O0

void __thiscall cornerstone::peer::set_snapshot_in_sync(peer *this,ptr<snapshot> *s)

{
  bool bVar1;
  __shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  shared_ptr<cornerstone::snapshot> *in_RDI;
  shared_ptr<cornerstone::snapshot> *in_stack_ffffffffffffffe0;
  
  bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_RDI);
  if (bVar1) {
    std::__shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::reset(in_RSI);
  }
  else {
    cs_new<cornerstone::snapshot_sync_ctx,std::shared_ptr<cornerstone::snapshot>const&>(in_RDI);
    std::shared_ptr<cornerstone::snapshot_sync_ctx>::operator=
              ((shared_ptr<cornerstone::snapshot_sync_ctx> *)in_stack_ffffffffffffffe0,
               (shared_ptr<cornerstone::snapshot_sync_ctx> *)in_RDI);
    std::shared_ptr<cornerstone::snapshot_sync_ctx>::~shared_ptr
              ((shared_ptr<cornerstone::snapshot_sync_ctx> *)0x1c3c55);
  }
  return;
}

Assistant:

void set_snapshot_in_sync(const ptr<snapshot>& s)
    {
        if (s == nilptr)
        {
            snp_sync_ctx_.reset();
        }
        else
        {
            snp_sync_ctx_ = cs_new<snapshot_sync_ctx>(s);
        }
    }